

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O2

void __thiscall sfc::Image::save(Image *this,string *path)

{
  uint code;
  runtime_error *this_00;
  char *pcVar1;
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,(path->_M_dataplus)._M_p,&local_39);
  code = lodepng::encode(&local_38,&this->_data,this->_width,this->_height,LCT_RGBA,8);
  std::__cxx11::string::~string((string *)&local_38);
  if (code == 0) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  pcVar1 = lodepng_error_text(code);
  std::runtime_error::runtime_error(this_00,pcVar1);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Image::save(const std::string& path) const {
  unsigned error = lodepng::encode(path.c_str(), _data, _width, _height, LCT_RGBA, 8);
  if (error)
    throw std::runtime_error(lodepng_error_text(error));
}